

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer ppcVar1;
  pointer pbVar2;
  cmExternalMakefileProjectGenerator *extraGenerator;
  __type _Var3;
  int iVar4;
  pointer ppcVar5;
  undefined4 extraout_var;
  cmGlobalGenerator *this_01;
  undefined4 extraout_var_01;
  const_reference pvVar6;
  pointer ppcVar7;
  string *globalGenerator;
  RegisteredGeneratorsVector *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  string name;
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  pointer local_a8;
  pointer local_a0;
  string local_98;
  cmExternalMakefileProjectGenerator *local_78;
  string local_70 [32];
  string local_50;
  undefined4 extraout_var_00;
  
  local_a8 = (this->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppcVar5 = (this->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (ppcVar5 != local_a8) {
    this_00 = *ppcVar5;
    local_a0 = ppcVar5;
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              (&local_c0,this_00);
    cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_98,this_00);
    _Var3 = std::operator==(&local_98,gname);
    std::__cxx11::string::~string((string *)&local_98);
    pbVar2 = local_c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    globalGenerator =
         local_c0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (_Var3) {
      iVar4 = (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(this_00);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&local_c0,0);
      local_78 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var_01,iVar4);
      std::__cxx11::string::string(local_70,(string *)pvVar6);
LAB_002263de:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      goto LAB_002263e8;
    }
    for (; globalGenerator != pbVar2; globalGenerator = globalGenerator + 1) {
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,this_00);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                (&local_98,globalGenerator,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      _Var3 = std::operator==(&local_98,gname);
      if (_Var3) {
        iVar4 = (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(this_00);
        local_78 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var,iVar4);
        std::__cxx11::string::string(local_70,(string *)globalGenerator);
        std::__cxx11::string::~string((string *)&local_98);
        goto LAB_002263de;
      }
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    ppcVar5 = local_a0 + 1;
  }
  local_78 = (cmExternalMakefileProjectGenerator *)0x0;
  std::__cxx11::string::string(local_70,(string *)gname);
LAB_002263e8:
  extraGenerator = local_78;
  std::__cxx11::string::string((string *)&local_98,local_70);
  ppcVar7 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppcVar7 == ppcVar1) {
      if (extraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*extraGenerator->_vptr_cmExternalMakefileProjectGenerator[1])(extraGenerator);
      }
      this_01 = (cmGlobalGenerator *)0x0;
      goto LAB_0022644d;
    }
    iVar4 = (*(*ppcVar7)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar7,&local_98,this);
    this_01 = (cmGlobalGenerator *)CONCAT44(extraout_var_00,iVar4);
    ppcVar7 = ppcVar7 + 1;
  } while (this_01 == (cmGlobalGenerator *)0x0);
  cmGlobalGenerator::SetExternalMakefileProjectGenerator(this_01,extraGenerator);
LAB_0022644d:
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_70);
  return this_01;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  std::pair<cmExternalMakefileProjectGenerator*, std::string> extra =
    createExtraGenerator(this->ExtraGenerators, gname);
  cmExternalMakefileProjectGenerator* extraGenerator = extra.first;
  const std::string name = extra.second;

  cmGlobalGenerator* generator = nullptr;
  for (cmGlobalGeneratorFactory* g : this->Generators) {
    generator = g->CreateGlobalGenerator(name, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
  } else {
    delete extraGenerator;
  }

  return generator;
}